

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

void __thiscall Lodtalk::StackMemory::useNewPageFor(StackMemory *this,uint8_t *framePointer)

{
  StackPage *pSVar1;
  
  pSVar1 = (this->stackPages).
           super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [(ulong)((long)framePointer - (long)this->stackMemoryLowest) >> 0xd];
  if (pSVar1->baseFramePointer != (uint8_t *)0x0) {
    if (this->currentPage != (StackPage *)0x0) {
      StackPage::freed(this->currentPage);
      std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
                (&this->freePages,&this->currentPage);
    }
    this->currentPage = pSVar1;
    return;
  }
  __assert_fail("newPage->isInUse()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x10d,"void Lodtalk::StackMemory::useNewPageFor(uint8_t *)");
}

Assistant:

size_t StackMemory::getPageIndexFor(uint8_t *pointer)
{
    return (pointer - stackMemoryLowest) / StackMemoryPageSize;
}